

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O0

void encode_block_inter(int plane,int block,int blk_row,int blk_col,BLOCK_SIZE plane_bsize,
                       TX_SIZE tx_size,void *arg,RUN_TYPE dry_run)

{
  int iVar1;
  long lVar2;
  byte bVar3;
  int iVar4;
  MACROBLOCKD *xd_00;
  int in_ECX;
  int in_EDX;
  int in_EDI;
  BLOCK_SIZE in_R8B;
  undefined1 in_R9B;
  void *unaff_retaddr;
  RUN_TYPE in_stack_00000008;
  undefined7 in_stack_00000009;
  int offsetc;
  int col;
  int offsetr;
  int row;
  int col_end;
  int row_end;
  int step;
  int bsh;
  int bsw;
  TX_SIZE sub_txs;
  TX_SIZE plane_tx_size;
  int max_blocks_wide;
  int max_blocks_high;
  macroblockd_plane *pd;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  encode_b_args *args;
  undefined8 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  BLOCK_SIZE in_stack_ffffffffffffff67;
  int local_98;
  int local_94;
  int local_6c;
  int local_64;
  long lVar5;
  int in_stack_ffffffffffffffe8;
  undefined2 in_stack_ffffffffffffffec;
  byte bVar6;
  int blk_row_00;
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  blk_row_00 = CONCAT13(in_R8B,CONCAT12(in_R9B,in_stack_ffffffffffffffec));
  lVar5 = CONCAT71(in_stack_00000009,in_stack_00000008);
  xd_00 = (MACROBLOCKD *)(*(long *)(lVar5 + 8) + 0x1a0);
  lVar2 = **(long **)(*(long *)(lVar5 + 8) + 0x2058);
  local_94 = max_block_high(xd_00,in_R8B,in_EDI);
  local_98 = max_block_wide(xd_00,(BLOCK_SIZE)((uint)blk_row_00 >> 0x18),in_EDI);
  if ((in_EDX < local_94) && (in_ECX < local_98)) {
    if (in_EDI == 0) {
      iVar4 = av1_get_txb_size_index((BLOCK_SIZE)((uint)blk_row_00 >> 0x18),in_EDX,in_ECX);
      bVar3 = *(byte *)(lVar2 + 0x92 + (long)iVar4);
    }
    else {
      bVar3 = av1_get_max_uv_txsize(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60,iVar4);
    }
    bVar6 = (byte)((uint)blk_row_00 >> 0x10);
    if ((bVar6 == bVar3) || (in_EDI != 0)) {
      encode_block(bsh,step,row_end,col_end,row._3_1_,row._2_1_,_max_blocks_wide,(RUN_TYPE)pd);
    }
    else {
      iVar4 = tx_size_wide_unit[""[bVar6]];
      iVar1 = tx_size_high_unit[""[bVar6]];
      if (tx_size_high_unit[bVar6] < local_94 - in_EDX) {
        local_94 = tx_size_high_unit[bVar6];
      }
      else {
        local_94 = local_94 - in_EDX;
      }
      if (tx_size_wide_unit[bVar6] < local_98 - in_ECX) {
        local_98 = tx_size_wide_unit[bVar6];
      }
      else {
        local_98 = local_98 - in_ECX;
      }
      for (local_64 = 0; local_64 < local_94; local_64 = iVar1 + local_64) {
        for (local_6c = 0; local_6c < local_98; local_6c = iVar4 + local_6c) {
          encode_block_inter(in_EDX,in_ECX,blk_row_00,in_stack_ffffffffffffffe8,
                             (BLOCK_SIZE)((ulong)lVar5 >> 0x38),(TX_SIZE)((ulong)lVar5 >> 0x30),
                             unaff_retaddr,in_stack_00000008);
        }
      }
    }
  }
  return;
}

Assistant:

static void encode_block_inter(int plane, int block, int blk_row, int blk_col,
                               BLOCK_SIZE plane_bsize, TX_SIZE tx_size,
                               void *arg, RUN_TYPE dry_run) {
  struct encode_b_args *const args = arg;
  MACROBLOCK *const x = args->x;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const struct macroblockd_plane *const pd = &xd->plane[plane];
  const int max_blocks_high = max_block_high(xd, plane_bsize, plane);
  const int max_blocks_wide = max_block_wide(xd, plane_bsize, plane);

  if (blk_row >= max_blocks_high || blk_col >= max_blocks_wide) return;

  const TX_SIZE plane_tx_size =
      plane ? av1_get_max_uv_txsize(mbmi->bsize, pd->subsampling_x,
                                    pd->subsampling_y)
            : mbmi->inter_tx_size[av1_get_txb_size_index(plane_bsize, blk_row,
                                                         blk_col)];
  if (!plane) {
    assert(tx_size_wide[tx_size] >= tx_size_wide[plane_tx_size] &&
           tx_size_high[tx_size] >= tx_size_high[plane_tx_size]);
  }

  if (tx_size == plane_tx_size || plane) {
    encode_block(plane, block, blk_row, blk_col, plane_bsize, tx_size, arg,
                 dry_run);
  } else {
    assert(tx_size < TX_SIZES_ALL);
    const TX_SIZE sub_txs = sub_tx_size_map[tx_size];
    assert(IMPLIES(tx_size <= TX_4X4, sub_txs == tx_size));
    assert(IMPLIES(tx_size > TX_4X4, sub_txs < tx_size));
    // This is the square transform block partition entry point.
    const int bsw = tx_size_wide_unit[sub_txs];
    const int bsh = tx_size_high_unit[sub_txs];
    const int step = bsh * bsw;
    const int row_end =
        AOMMIN(tx_size_high_unit[tx_size], max_blocks_high - blk_row);
    const int col_end =
        AOMMIN(tx_size_wide_unit[tx_size], max_blocks_wide - blk_col);
    assert(bsw > 0 && bsh > 0);

    for (int row = 0; row < row_end; row += bsh) {
      const int offsetr = blk_row + row;
      for (int col = 0; col < col_end; col += bsw) {
        const int offsetc = blk_col + col;

        encode_block_inter(plane, block, offsetr, offsetc, plane_bsize, sub_txs,
                           arg, dry_run);
        block += step;
      }
    }
  }
}